

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfPerfCounter.c
# Opt level: O0

uint64_t sbfPerfCounter_frequency(void)

{
  int iVar1;
  __ssize_t _Var2;
  unsigned_long_long n;
  size_t size;
  char *line;
  FILE *f;
  uint64_t local_28;
  size_t local_20;
  char *local_18;
  FILE *local_10;
  
  if ((sbfPerfCounter_frequency::processed == 0) &&
     (local_10 = fopen("/proc/cpuinfo","r"), local_10 != (FILE *)0x0)) {
    local_18 = (char *)0x0;
    do {
      _Var2 = getline(&local_18,&local_20,local_10);
      if (_Var2 == -1) goto LAB_00109e4c;
      iVar1 = __isoc99_sscanf(local_18,"cpu MHz         : %llu.",&local_28);
    } while (iVar1 != 1);
    sbfPerfCounter_frequency::frequency = local_28;
LAB_00109e4c:
    free(local_18);
    fclose(local_10);
    sbfPerfCounter_frequency::processed = 1;
  }
  return sbfPerfCounter_frequency::frequency;
}

Assistant:

uint64_t
sbfPerfCounter_frequency (void)
{
    static uint64_t    frequency;
    static int         processed = 0;
    FILE*              f;
    char*              line;
    size_t             size;
    unsigned long long n;

    // Get the frequence and cache it
    if (processed == 0)
    {
        f = fopen ("/proc/cpuinfo", "r");
        // Not supported method to collect CPU Frequency
        if (f == NULL)
            return frequency;

        // Collect CPU frequency looking for cpu MHz line
        line = NULL;
        while (getline (&line, &size, f) != -1)
        {
            if (sscanf (line, "cpu MHz         : %llu.", &n) == 1)
            {
                frequency = n;
                break;
            }
        }

        free (line);
        fclose (f);

        processed = 1;
    }

    return frequency;
}